

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predict.hpp
# Opt level: O2

double extract_spC<PredictionData<float,unsigned_long>>
                 (PredictionData<float,_unsigned_long> *prediction_data,size_t row,size_t col_num)

{
  unsigned_long *puVar1;
  double dVar2;
  
  puVar1 = std::__lower_bound<unsigned_long*,unsigned_long,__gnu_cxx::__ops::_Iter_less_val>
                     (prediction_data->Xc_ind + prediction_data->Xc_indptr[col_num],
                      prediction_data->Xc_ind + prediction_data->Xc_indptr[col_num + 1]);
  dVar2 = 0.0;
  if ((puVar1 != prediction_data->Xc_ind + prediction_data->Xc_indptr[col_num + 1]) &&
     (*puVar1 == row)) {
    dVar2 = (double)*(float *)((long)prediction_data->Xc +
                              ((long)puVar1 - (long)prediction_data->Xc_ind >> 1));
  }
  return dVar2;
}

Assistant:

double extract_spC(const PredictionData &prediction_data, size_t row, size_t col_num) noexcept
{
    const decltype(prediction_data.Xc_indptr)
               search_res = std::lower_bound(prediction_data.Xc_ind + prediction_data.Xc_indptr[col_num],
                                             prediction_data.Xc_ind + prediction_data.Xc_indptr[col_num + 1],
                                             row);
    if (
        search_res == (prediction_data.Xc_ind + prediction_data.Xc_indptr[col_num + 1])
            ||
        (*search_res) != static_cast<typename std::remove_pointer<decltype(search_res)>::type>(row)
        )
        return 0.;
    else
        return prediction_data.Xc[search_res - prediction_data.Xc_ind];
}